

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
* __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
::insert_unique<int,int_const&>
          (pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
           *__return_storage_ptr__,
          btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
          *this,int *key,int *args)

{
  bool bVar1;
  node_type *pnVar2;
  btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
  *this_00;
  template_ElementType<3UL> *ptVar3;
  int iVar4;
  SearchResult<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_false>
  SVar5;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  bVar6;
  iterator iVar7;
  
  if (*(long *)(this + 0x10) == 0) {
    pnVar2 = btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
             ::new_leaf_root_node
                       ((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                         *)this,'\x01');
    *(node_type **)(this + 8) = pnVar2;
    *(node_type **)this = pnVar2;
  }
  SVar5 = btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::internal_locate<int>
                    ((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                      *)this,key);
  bVar6._8_8_ = SVar5.value._8_8_;
  bVar6.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 *)(ulong)(uint)SVar5.value.position_;
  bVar6 = internal_last<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int_const&,int_const*>>
                    ((btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                      *)SVar5.value.node_,bVar6);
  this_00 = (btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
             *)bVar6.node_;
  if (this_00 !=
      (btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
       *)0x0) {
    iVar4 = bVar6.position_;
    ptVar3 = btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
             ::GetField<3ul>(this_00);
    if (ptVar3[iVar4] <= *key) {
      bVar1 = false;
      goto LAB_0019af6a;
    }
  }
  iVar7._12_4_ = 0;
  iVar7.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                 *)SUB128(SVar5.value._0_12_,0);
  iVar7.position_ = SUB124(SVar5.value._0_12_,8);
  iVar7 = internal_emplace<int_const&>(this,iVar7,args);
  this_00 = (btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
             *)iVar7.node_;
  iVar4 = iVar7.position_;
  bVar1 = true;
LAB_0019af6a:
  (__return_storage_ptr__->first).node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
        *)this_00;
  (__return_storage_ptr__->first).position_ = iVar4;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const K &key, Args &&...args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = mutable_rightmost() = new_leaf_root_node(1);
  }

  SearchResult<iterator, is_key_compare_to::value> res = internal_locate(key);
  iterator iter = res.value;

  if (res.HasMatch()) {
    if (res.IsEq()) {
      // The key already exists in the tree, do nothing.
      return {iter, false};
    }
  } else {
    iterator last = internal_last(iter);
    if (last.node_ && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return {last, false};
    }
  }
  return {internal_emplace(iter, std::forward<Args>(args)...), true};
}